

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::
     class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
     ::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  void *pvVar2;
  ulong uVar3;
  align_val_t aVar4;
  instance *piVar5;
  byte bVar6;
  byte bVar7;
  undefined1 local_28 [8];
  error_scope scope;
  
  PyErr_Fetch(local_28,&scope,&scope.value);
  piVar5 = v_h->inst;
  bVar6 = piVar5->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar7 = (piVar5->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar7 = bVar6 & 4;
  }
  if (bVar7 == 0) {
    pvVar2 = *v_h->vh;
    uVar3 = v_h->type->type_size;
    aVar4 = v_h->type->type_align;
    if (aVar4 < 0x11) {
      operator_delete(pvVar2,uVar3);
    }
    else {
      operator_delete(pvVar2,uVar3,aVar4);
    }
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v_h->vh[2];
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      piVar5 = v_h->inst;
      bVar6 = piVar5->field_0x30;
    }
    if ((bVar6 & 2) == 0) {
      pbVar1 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar5->field_0x30 = bVar6 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope((error_scope *)local_28);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }